

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void check_exit_request_aarch64(TCGContext_conflict1 *tcg_ctx)

{
  TCGv_ptr pTVar1;
  TCGTemp *ts;
  TCGOp *pTVar2;
  
  if (tcg_ctx->uc->no_exit_request != false) {
    return;
  }
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  pTVar1 = tcg_ctx->cpu_env;
  pTVar2 = tcg_emit_op_aarch64(tcg_ctx,INDEX_op_ld_i32);
  pTVar2->args[0] = (TCGArg)ts;
  pTVar2->args[1] = (TCGArg)(pTVar1 + (long)tcg_ctx);
  pTVar2->args[2] = 0xfffffffffffffff0;
  tcg_gen_brcondi_i32_aarch64
            (tcg_ctx,TCG_COND_LT,(TCGv_i32)((long)ts - (long)tcg_ctx),0,tcg_ctx->exitreq_label);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

void check_exit_request(TCGContext *tcg_ctx)
{
    TCGv_i32 count;

    // Unicorn:
    //   For ARM IT block, we couldn't exit in the middle of the
    //   block and this is the our hack here.
    if (tcg_ctx->uc->no_exit_request) {
        return;
    }

    count = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_ld_i32(tcg_ctx, count, tcg_ctx->cpu_env,
                   offsetof(ArchCPU, neg.icount_decr.u32) -
                   offsetof(ArchCPU, env));

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_LT, count, 0, tcg_ctx->exitreq_label);

    tcg_temp_free_i32(tcg_ctx, count);
}